

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

void Of_CutParams(Of_Man_t *p,Of_Cut_t *pCut,int nGiaRefs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Jf_Par_t *pJVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar1 = *(uint *)&pCut->field_0x10;
  uVar6 = uVar1 >> 0x1b;
  pJVar4 = p->pPars;
  if (pJVar4->nLutSize < (int)uVar6) {
    __assert_fail("nLeaves <= p->pPars->nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                  ,0x2a1,"void Of_CutParams(Of_Man_t *, Of_Cut_t *, int)");
  }
  pCut->Delay = 0;
  pCut->Flow = 0;
  if (0x7ffffff < uVar1) {
    iVar5 = pCut->Delay;
    uVar7 = 0;
    do {
      iVar2 = pCut->pLeaves[uVar7];
      lVar8 = (long)iVar2;
      if ((lVar8 < 0) || ((p->vCutDelays).nSize <= iVar2)) {
LAB_0078dd62:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = (p->vCutDelays).pArray[lVar8];
      if (iVar5 <= iVar3) {
        iVar5 = iVar3;
      }
      pCut->Delay = iVar5;
      if ((p->vCutFlows).nSize <= iVar2) goto LAB_0078dd62;
      pCut->Flow = pCut->Flow + (p->vCutFlows).pArray[lVar8];
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  pCut->Delay = (pCut->Delay + 1) - (uint)(uVar1 < 0x10000000);
  iVar5 = 0;
  if (0xfffffff < uVar1) {
    iVar5 = (uVar6 + pJVar4->nAreaTuner) * 100;
  }
  pCut->Flow = (iVar5 + pCut->Flow) / (int)(nGiaRefs + (uint)(nGiaRefs == 0));
  return;
}

Assistant:

static inline void Of_CutParams( Of_Man_t * p, Of_Cut_t * pCut, int nGiaRefs )
{
    int i, nLeaves = pCut->nLeaves; 
    assert( nLeaves <= p->pPars->nLutSize );
    pCut->Delay = 0;
    pCut->Flow  = 0;
    for ( i = 0; i < nLeaves; i++ )
    {
        pCut->Delay = Abc_MaxInt( pCut->Delay, Of_ObjCutDelay(p, pCut->pLeaves[i]) );
        pCut->Flow += Of_ObjCutFlow(p, pCut->pLeaves[i]);
    }
    pCut->Delay += (int)(nLeaves > 1);
    pCut->Flow = (pCut->Flow + 100 * Of_CutArea(p, nLeaves)) / (nGiaRefs ? nGiaRefs : 1);
}